

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<896,Blob<256>>
               (hashfunc<Blob<256>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool result;
  Blob<256> h;
  keytype k;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  undefined1 local_c4 [4];
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffff40;
  Blob<896> *in_stack_ffffffffffffff48;
  uint8_t in_stack_ffffffffffffff57;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  pfHash in_stack_ffffffffffffff60;
  Blob<896> local_98;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x380,pcVar4,(ulong)in_ESI);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x198ddf);
  Blob<896>::Blob(&local_98);
  memset(&local_98,0,0x70);
  if ((local_d & 1) != 0) {
    Blob<256>::Blob((Blob<256> *)local_c4);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&local_98,0x70,0,local_c4);
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back
              ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)CONCAT44(in_ESI,in_EDX),
               (value_type *)CONCAT44(in_ECX,in_R8D));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<896>,Blob<256>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             (bool)in_stack_ffffffffffffff57,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  sVar3 = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar1 = TestHashList<Blob<256>>
                    (stack0x00000040,(bool)h.bytes[0x1b],(bool)h.bytes[0x1a],(bool)h.bytes[0x19],
                     (bool)h.bytes[0x18],(bool)h.bytes[0x17]);
  printf("\n");
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)CONCAT44(in_ESI,in_EDX));
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}